

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void wasm_global_set(wasm_global_t *global,wasm_val_t *val)

{
  ObjectKind OVar1;
  Global *this;
  TypedValue local_30;
  
  fprintf(_stderr,"CAPI: [%s] \n","wasm_global_set");
  this = (Global *)(global->super_wasm_extern_t).super_wasm_ref_t.I.obj_;
  OVar1 = (this->super_Extern).super_Object.kind_;
  if ((char)val->kind < '\0') {
    if (OVar1 == Global) {
      wabt::interp::Global::Set
                (this,(global->super_wasm_extern_t).super_wasm_ref_t.I.store_,
                 (Ref)(((((val->of).ref)->I).obj_)->self_).index);
      return;
    }
  }
  else if (OVar1 == Global) {
    ToWabtValue(&local_30,val);
    wabt::interp::Global::UnsafeSet(this,local_30.value);
    return;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::Global, Base = wabt::interp::Object]"
               );
}

Assistant:

void wasm_global_set(wasm_global_t* global, const wasm_val_t* val) {
  TRACE0();
  if (wasm_valkind_is_ref(val->kind)) {
    global->As<Global>()->Set(*global->I.store(), val->of.ref->I->self());
  } else {
    global->As<Global>()->UnsafeSet(ToWabtValue(*val).value);
  }
}